

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O2

void test_empty(void)

{
  int iVar1;
  HTABLE_NODE *node;
  HTABLE htable;
  
  htable.planes = (void **)0x0;
  htable.n_planes = 0;
  htable._12_4_ = 0;
  htable.n = 0;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x66,"%s","htable_is_empty(&htable)");
  node = make_val("key",0x2a);
  iVar1 = htable_insert(&htable,node,cmp_func,hash_func);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x67,"%s",
                 "htable_insert(&htable, make_val(\"key\", 42), cmp_func, hash_func) == 0");
  acutest_check_((uint)(htable.n != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x68,"%s","!htable_is_empty(&htable)");
  htable_fini(&htable,dtor_func);
  acutest_check_((uint)(htable.n == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x6a,"%s","htable_is_empty(&htable)");
  return;
}

Assistant:

static void
test_empty(void)
{
    HTABLE htable = HTABLE_INITIALIZER;

    TEST_CHECK(htable_is_empty(&htable));
    TEST_CHECK(htable_insert(&htable, make_val("key", 42), cmp_func, hash_func) == 0);
    TEST_CHECK(!htable_is_empty(&htable));
    htable_fini(&htable, dtor_func);
    TEST_CHECK(htable_is_empty(&htable));
}